

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_linearsolver.c
# Opt level: O0

SUNErrCode SUNLinSolInitialize(SUNLinearSolver S)

{
  long in_RDI;
  SUNErrCode ier;
  undefined4 local_c;
  
  if (*(long *)(*(long *)(in_RDI + 8) + 0x30) == 0) {
    local_c = 0;
  }
  else {
    local_c = (**(code **)(*(long *)(in_RDI + 8) + 0x30))(in_RDI);
  }
  return local_c;
}

Assistant:

SUNErrCode SUNLinSolInitialize(SUNLinearSolver S)
{
  SUNErrCode ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(S));
  if (S->ops->initialize) { ier = S->ops->initialize(S); }
  else { ier = SUN_SUCCESS; }
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(S));
  return (ier);
}